

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultModel.cpp
# Opt level: O1

QSize __thiscall ResultModel::span(ResultModel *this,QModelIndex *index)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Data *pDVar4;
  bool bVar5;
  int iVar6;
  QSize extraout_RAX;
  QString *args;
  ulong uVar7;
  ResultModel *pRVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QArrayDataPointer<char16_t> QStack_70;
  undefined8 uStack_58;
  ResultModel *pRStack_50;
  QModelIndex local_40;
  
  uVar7 = 0xffffffff00000000;
  uVar12 = 0xffffffff;
  uVar1 = index->r;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 0) goto LAB_0010a380;
  uVar2 = index->c;
  uVar11 = (ulong)uVar2;
  if (((int)uVar2 < 0) || (index->m == (QAbstractItemModel *)0x0)) goto LAB_0010a380;
  pRVar8 = this;
  if (uVar2 == 1) {
    if (uVar9 < (ulong)(this->m_data).d.size) {
      if ((this->m_data).d.ptr[uVar9].merged != false) {
        uVar7 = 0x100000000;
        uVar12 = 2;
        goto LAB_0010a380;
      }
      goto LAB_0010a2f5;
    }
    pRStack_50 = (ResultModel *)0x10a399;
    span();
LAB_0010a399:
    pRStack_50 = (ResultModel *)0x10a39e;
    span();
LAB_0010a39e:
    pRStack_50 = (ResultModel *)0x10a3a3;
    span();
  }
  else {
LAB_0010a2f5:
    index = &local_40;
    local_40.r = -1;
    local_40.c = -1;
    local_40.i = 0;
    local_40.m = (QAbstractItemModel *)0x0;
    pRStack_50 = (ResultModel *)0x10a311;
    iVar6 = (**(code **)(*(long *)this + 0x78))();
    if (iVar6 + -1 <= (int)uVar1) {
LAB_0010a380:
      return (QSize)(uVar7 | uVar12);
    }
    uVar3 = (this->m_data).d.size;
    if (uVar3 <= uVar9) goto LAB_0010a399;
    pDVar4 = (this->m_data).d.ptr;
    if ((ulong)pDVar4[uVar9].list.d.size <= uVar11) goto LAB_0010a39e;
    uVar10 = uVar9 + 1;
    if (uVar10 < uVar3) {
      if (uVar11 < (ulong)pDVar4[uVar10].list.d.size) {
        pRStack_50 = (ResultModel *)0x10a36c;
        bVar5 = operator==(pDVar4[uVar9].list.d.ptr + uVar11,pDVar4[uVar10].list.d.ptr + uVar11);
        if (bVar5) {
          uVar12 = 1;
          uVar7 = 0x200000000;
        }
        goto LAB_0010a380;
      }
      goto LAB_0010a3a8;
    }
  }
  pRStack_50 = (ResultModel *)0x10a3a8;
  span();
LAB_0010a3a8:
  pRStack_50 = (ResultModel *)0x10a3ad;
  span();
  uStack_58 = 0xffffffff00000000;
  *(undefined8 *)pRVar8 = 0;
  *(undefined8 *)&pRVar8->field_0x8 = 0;
  (pRVar8->m_data).d.d = (Data *)0x0;
  pRStack_50 = this;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)pRVar8,0,(QString *)index);
  QString::number((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),(char)&QStack_70,0x67);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)pRVar8,(qsizetype)(pRVar8->m_data).d.d,
             (QString *)&QStack_70);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)pRVar8,(qsizetype)(pRVar8->m_data).d.d,args);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_70);
  *(undefined1 *)&(pRVar8->m_data).d.ptr = 0;
  return extraout_RAX;
}

Assistant:

QSize ResultModel::span(const QModelIndex &index) const
{
    if (!index.isValid())
        return QSize();

    const int row = index.row();
    const int column = index.column();

    if (column == 1 && m_data[row].merged)
        return QSize(2, 1);

    if (row < rowCount() - 1 && m_data[row].list.at(column) == m_data[row + 1].list.at(column))
        return QSize(1, 2);

    return QSize();
}